

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int push_signature_algorithms(ptls_buffer_t *sendbuf)

{
  uint8_t *puVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = ptls_buffer_reserve(sendbuf,2);
  if (iVar4 == 0) {
    puVar1 = sendbuf->base;
    sVar2 = sendbuf->off;
    (puVar1 + sVar2)[0] = '\0';
    (puVar1 + sVar2)[1] = '\0';
    sVar2 = sendbuf->off;
    sendbuf->off = sVar2 + 2;
    iVar4 = ptls_buffer_reserve(sendbuf,2);
    if (iVar4 == 0) {
      puVar1 = sendbuf->base;
      sVar3 = sendbuf->off;
      (puVar1 + sVar3)[0] = '\b';
      (puVar1 + sVar3)[1] = '\x04';
      sendbuf->off = sendbuf->off + 2;
      iVar4 = ptls_buffer_reserve(sendbuf,2);
      if (iVar4 == 0) {
        puVar1 = sendbuf->base;
        sVar3 = sendbuf->off;
        (puVar1 + sVar3)[0] = '\x04';
        (puVar1 + sVar3)[1] = '\x03';
        sendbuf->off = sendbuf->off + 2;
        iVar4 = ptls_buffer_reserve(sendbuf,2);
        if (iVar4 == 0) {
          puVar1 = sendbuf->base;
          sVar3 = sendbuf->off;
          (puVar1 + sVar3)[0] = '\x04';
          (puVar1 + sVar3)[1] = '\x01';
          sendbuf->off = sendbuf->off + 2;
          iVar4 = ptls_buffer_reserve(sendbuf,2);
          if (iVar4 == 0) {
            puVar1 = sendbuf->base;
            sVar3 = sendbuf->off;
            (puVar1 + sVar3)[0] = '\x02';
            (puVar1 + sVar3)[1] = '\x01';
            sVar3 = sendbuf->off;
            sendbuf->off = sVar3 + 2;
            lVar5 = sVar3 - sVar2;
            sendbuf->base[sVar2] = (uint8_t)((ulong)lVar5 >> 8);
            sendbuf->base[sVar2 + 1] = (uint8_t)lVar5;
            iVar4 = 0;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int push_signature_algorithms(ptls_buffer_t *sendbuf)
{
    int ret;

    ptls_buffer_push_block(sendbuf, 2, {
        ptls_buffer_push16(sendbuf, PTLS_SIGNATURE_RSA_PSS_RSAE_SHA256);
        ptls_buffer_push16(sendbuf, PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256);
        ptls_buffer_push16(sendbuf, PTLS_SIGNATURE_RSA_PKCS1_SHA256);
        ptls_buffer_push16(sendbuf, PTLS_SIGNATURE_RSA_PKCS1_SHA1);
    });

    ret = 0;
Exit:
    return ret;
}